

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.h
# Opt level: O0

void __thiscall
ByteCodeGenerator::PushJumpCleanupForTry
          (ByteCodeGenerator *this,OpCode tryOp,ByteCodeLabel label,RegSlot regSlot1,
          RegSlot regSlot2)

{
  JumpCleanupInfo local_40;
  RegSlot local_20;
  RegSlot local_1c;
  RegSlot regSlot2_local;
  RegSlot regSlot1_local;
  ByteCodeLabel label_local;
  OpCode tryOp_local;
  ByteCodeGenerator *this_local;
  
  local_40.loopNode = (ParseNode *)0x0;
  local_40.loopId = 0;
  local_40.tryOp = tryOp;
  local_40.label = label;
  local_40.regSlot1 = regSlot1;
  local_40.regSlot2 = regSlot2;
  local_20 = regSlot2;
  local_1c = regSlot1;
  regSlot2_local = label;
  regSlot1_local._2_2_ = tryOp;
  _label_local = this;
  DList<JumpCleanupInfo,_Memory::ArenaAllocator,_RealCount>::Prepend
            (this->jumpCleanupList,&local_40);
  return;
}

Assistant:

void PushJumpCleanupForTry(
        Js::OpCode tryOp,
        Js::ByteCodeLabel label = 0,
        Js::RegSlot regSlot1 = Js::Constants::NoRegister,
        Js::RegSlot regSlot2 = Js::Constants::NoRegister)
    {
        this->jumpCleanupList->Prepend({nullptr, 0, tryOp, label, regSlot1, regSlot2});
    }